

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O3

int mbedtls_x509_crt_parse_der(mbedtls_x509_crt *chain,uchar *buf,size_t buflen)

{
  size_t __n;
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  mbedtls_x509_crt *pmVar5;
  uchar *puVar6;
  mbedtls_x509_crt *pmVar7;
  uchar *puVar8;
  uchar *end;
  size_t len;
  mbedtls_x509_buf sig_params1;
  mbedtls_x509_buf sig_params2;
  uchar *local_a8;
  ulong local_a0;
  int *local_98;
  mbedtls_x509_crt *local_90;
  mbedtls_x509_buf local_88;
  size_t local_70;
  mbedtls_x509_buf local_68;
  mbedtls_x509_buf local_48;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crt *)0x0) {
    return -0x2800;
  }
  pmVar5 = chain;
  if (chain->version == 0) {
    pmVar7 = (mbedtls_x509_crt *)0x0;
  }
  else {
    do {
      pmVar7 = pmVar5;
      pmVar5 = pmVar7->next;
      if (pmVar5 == (mbedtls_x509_crt *)0x0) {
        pmVar5 = (mbedtls_x509_crt *)calloc(1,0x228);
        pmVar7->next = pmVar5;
        if (pmVar5 == (mbedtls_x509_crt *)0x0) {
          return -0x2880;
        }
        memset(pmVar5,0,0x228);
        pmVar5 = pmVar7->next;
        break;
      }
    } while (pmVar5->version != 0);
  }
  local_88.tag = 0;
  local_88._4_4_ = 0;
  local_88.len = 0;
  local_88.p = (uchar *)0x0;
  local_48.tag = 0;
  local_48._4_4_ = 0;
  local_48.len = 0;
  local_48.p = (uchar *)0x0;
  local_68.tag = 0;
  local_68._4_4_ = 0;
  local_68.len = 0;
  local_68.p = (uchar *)0x0;
  if (pmVar5 == (mbedtls_x509_crt *)0x0) {
    iVar3 = -0x2800;
    goto LAB_0010f2c7;
  }
  local_a8 = buf;
  local_a0 = buflen;
  local_90 = chain;
  iVar2 = mbedtls_asn1_get_tag(&local_a8,buf + buflen,&local_a0,0x30);
  uVar1 = local_a0;
  iVar3 = -0x2180;
  if (iVar2 != 0) goto LAB_0010f2b3;
  if ((ulong)((long)(buf + buflen) - (long)local_a8) < local_a0) {
LAB_0010f2ae:
    iVar3 = -0x21e6;
  }
  else {
    puVar8 = local_a8 + (local_a0 - (long)buf);
    (pmVar5->raw).len = (size_t)puVar8;
    puVar6 = (uchar *)calloc(1,(size_t)puVar8);
    (pmVar5->raw).p = puVar6;
    if (puVar6 == (uchar *)0x0) {
      iVar3 = -0x2880;
      chain = local_90;
      goto LAB_0010f2c7;
    }
    memcpy(puVar6,buf,(size_t)puVar8);
    local_a8 = puVar6 + ((long)puVar8 - uVar1);
    puVar6 = puVar6 + (long)puVar8;
    (pmVar5->tbs).p = local_a8;
    iVar3 = mbedtls_asn1_get_tag(&local_a8,puVar6,&local_a0,0x30);
    if (iVar3 != 0) goto LAB_0010f359;
    puVar8 = local_a8 + local_a0;
    (pmVar5->tbs).len = (long)puVar8 - (long)(pmVar5->tbs).p;
    local_98 = &pmVar5->version;
    iVar3 = mbedtls_asn1_get_tag(&local_a8,puVar8,&local_70,0xa0);
    if (iVar3 == 0) {
      end = local_a8 + local_70;
      iVar3 = mbedtls_asn1_get_int(&local_a8,end,local_98);
      if (iVar3 != 0) {
        iVar3 = iVar3 + -0x2200;
        goto LAB_0010f3f2;
      }
      if (local_a8 != end) {
        iVar3 = -0x2266;
        goto LAB_0010f2b3;
      }
    }
    else if (iVar3 == -0x62) {
      *local_98 = 0;
    }
    else {
LAB_0010f3f2:
      if (iVar3 != 0) goto LAB_0010f2b3;
    }
    iVar3 = mbedtls_x509_get_serial(&local_a8,puVar8,&pmVar5->serial);
    if (iVar3 == 0) {
      iVar3 = mbedtls_x509_get_alg(&local_a8,puVar8,&pmVar5->sig_oid,&local_88);
      if (iVar3 == 0) {
        uVar4 = *local_98;
        *local_98 = uVar4 + 1;
        iVar3 = -0x2580;
        if (((int)uVar4 < 3) &&
           (iVar3 = mbedtls_x509_get_sig_alg
                              (&pmVar5->sig_oid,&local_88,&pmVar5->sig_md,&pmVar5->sig_pk,
                               &pmVar5->sig_opts), iVar3 == 0)) {
          (pmVar5->issuer_raw).p = local_a8;
          iVar3 = mbedtls_asn1_get_tag(&local_a8,puVar8,&local_a0,0x30);
          if (iVar3 != 0) {
LAB_0010f359:
            chain = local_90;
            mbedtls_x509_crt_free(pmVar5);
            iVar3 = iVar3 + -0x2180;
            if (iVar3 == 0) {
              return 0;
            }
            goto LAB_0010f2c7;
          }
          iVar3 = mbedtls_x509_get_name(&local_a8,local_a8 + local_a0,&pmVar5->issuer);
          if (iVar3 == 0) {
            (pmVar5->issuer_raw).len = (long)local_a8 - (long)(pmVar5->issuer_raw).p;
            iVar3 = x509_get_dates(&local_a8,puVar8,&pmVar5->valid_from,&pmVar5->valid_to);
            if (iVar3 == 0) {
              (pmVar5->subject_raw).p = local_a8;
              iVar3 = mbedtls_asn1_get_tag(&local_a8,puVar8,&local_a0,0x30);
              if (iVar3 != 0) goto LAB_0010f359;
              if ((local_a0 == 0) ||
                 (iVar3 = mbedtls_x509_get_name(&local_a8,local_a8 + local_a0,&pmVar5->subject),
                 iVar3 == 0)) {
                (pmVar5->subject_raw).len = (long)local_a8 - (long)(pmVar5->subject_raw).p;
                iVar3 = mbedtls_pk_parse_subpubkey(&local_a8,puVar8,&pmVar5->pk);
                if (iVar3 == 0) {
                  uVar4 = *local_98;
                  if ((uVar4 & 0xfffffffe) == 2) {
                    iVar3 = x509_get_uid(&local_a8,puVar8,&pmVar5->issuer_id,1);
                    if (iVar3 != 0) goto LAB_0010f2b3;
                    uVar4 = *local_98;
                  }
                  if (((uVar4 & 0xfffffffe) != 2) ||
                     ((iVar3 = x509_get_uid(&local_a8,puVar8,&pmVar5->subject_id,2), iVar3 == 0 &&
                      ((*local_98 != 3 ||
                       (iVar3 = x509_get_crt_ext(&local_a8,puVar8,pmVar5), iVar3 == 0)))))) {
                    if (local_a8 != puVar8) goto LAB_0010f2ae;
                    iVar3 = mbedtls_x509_get_alg(&local_a8,puVar6,&local_68,&local_48);
                    if (iVar3 == 0) {
                      __n = (pmVar5->sig_oid).len;
                      iVar3 = -0x2680;
                      if ((((__n == local_68.len) &&
                           (iVar2 = bcmp((pmVar5->sig_oid).p,local_68.p,__n), iVar2 == 0)) &&
                          (local_88.len == local_48.len)) &&
                         (((local_88.len == 0 ||
                           (iVar2 = bcmp(local_88.p,local_48.p,local_88.len), iVar2 == 0)) &&
                          ((iVar3 = mbedtls_x509_get_sig(&local_a8,puVar6,&pmVar5->sig), iVar3 == 0
                           && (iVar3 = -0x21e6, local_a8 == puVar6)))))) {
                        return 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010f2b3:
  mbedtls_x509_crt_free(pmVar5);
  chain = local_90;
LAB_0010f2c7:
  if (pmVar7 != (mbedtls_x509_crt *)0x0) {
    pmVar7->next = (mbedtls_x509_crt *)0x0;
  }
  if (pmVar5 != chain) {
    free(pmVar5);
  }
  return iVar3;
}

Assistant:

int mbedtls_x509_crt_parse_der( mbedtls_x509_crt *chain, const unsigned char *buf,
                        size_t buflen )
{
    int ret;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if( crt == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    while( crt->version != 0 && crt->next != NULL )
    {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if( crt->version != 0 && crt->next == NULL )
    {
        crt->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) );

        if( crt->next == NULL )
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );

        prev = crt;
        mbedtls_x509_crt_init( crt->next );
        crt = crt->next;
    }

    if( ( ret = x509_crt_parse_der_core( crt, buf, buflen ) ) != 0 )
    {
        if( prev )
            prev->next = NULL;

        if( crt != chain )
            mbedtls_free( crt );

        return( ret );
    }

    return( 0 );
}